

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O3

TypeBase * GetBaseType(ExpressionContext *ctx,VmType type)

{
  uint uVar1;
  VmValueType VVar2;
  
  VVar2 = type.type;
  uVar1 = type.size;
  if ((VVar2 == VM_TYPE_VOID) && (uVar1 == 0)) {
    return ctx->typeVoid;
  }
  if ((VVar2 == VM_TYPE_INT) && (uVar1 == 4)) {
    return ctx->typeInt;
  }
  if ((VVar2 == VM_TYPE_DOUBLE) && (uVar1 == 8)) {
    return ctx->typeDouble;
  }
  if ((VVar2 == VM_TYPE_LONG) && (uVar1 == 8)) {
    return ctx->typeLong;
  }
  if (2 < VVar2 - VM_TYPE_POINTER) {
    if ((VVar2 == VM_TYPE_AUTO_REF) && (uVar1 == 0xc)) {
      return &ctx->typeAutoRef->super_TypeBase;
    }
    if ((VVar2 == VM_TYPE_AUTO_ARRAY) && (uVar1 == 0x10)) {
      return &ctx->typeAutoArray->super_TypeBase;
    }
    if (VVar2 != VM_TYPE_STRUCT) {
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                    ,0x246,"TypeBase *GetBaseType(ExpressionContext &, VmType)");
    }
  }
  return type.structType;
}

Assistant:

TypeBase* GetBaseType(ExpressionContext &ctx, VmType type)
{
	if(type == VmType::Void)
		return ctx.typeVoid;
	else if(type == VmType::Int)
		return ctx.typeInt;
	else if(type == VmType::Double)
		return ctx.typeDouble;
	else if(type == VmType::Long)
		return ctx.typeLong;
	else if(type.type == VM_TYPE_POINTER)
		return type.structType;
	else if(type.type == VM_TYPE_FUNCTION_REF)
		return type.structType;
	else if(type.type == VM_TYPE_ARRAY_REF)
		return type.structType;
	else if(type == VmType::AutoRef)
		return ctx.typeAutoRef;
	else if(type == VmType::AutoArray)
		return ctx.typeAutoArray;
	else if(type.type == VM_TYPE_STRUCT)
		return type.structType;
	else
		assert(!"unknown type");

	return NULL;
}